

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_json_relation.cpp
# Opt level: O2

string * __thiscall
duckdb::ReadJSONRelation::GetAlias_abi_cxx11_(string *__return_storage_ptr__,ReadJSONRelation *this)

{
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->alias);
  return __return_storage_ptr__;
}

Assistant:

string ReadJSONRelation::GetAlias() {
	return alias;
}